

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 jx9HashmapRelease(jx9_hashmap *pMap,int FreeDS)

{
  jx9_vm *pVm;
  jx9_hashmap_node *pjVar1;
  sxi32 sVar2;
  uint uVar3;
  jx9_hashmap_node *pChunk;
  
  pVm = pMap->pVm;
  if (pMap->nEntry != 0) {
    uVar3 = 0;
    pChunk = pMap->pFirst;
    do {
      pjVar1 = pChunk->pPrev;
      jx9VmUnsetMemObj(pVm,pChunk->nValIdx);
      if (pChunk->iType == 2) {
        SyBlobRelease(&(pChunk->xKey).sKey);
      }
      SyMemBackendPoolFree(&pVm->sAllocator,pChunk);
      uVar3 = uVar3 + 1;
      pChunk = pjVar1;
    } while (uVar3 < pMap->nEntry);
    if (pMap->nEntry != 0) {
      SyMemBackendFree(&pVm->sAllocator,pMap->apBucket);
    }
  }
  if (FreeDS != 0) {
    sVar2 = SyMemBackendPoolFree(&pVm->sAllocator,pMap);
    return sVar2;
  }
  pMap->iNextIdx = 0;
  pMap->apBucket = (jx9_hashmap_node **)0x0;
  pMap->pFirst = (jx9_hashmap_node *)0x0;
  pMap->pLast = (jx9_hashmap_node *)0x0;
  pMap->pCur = (jx9_hashmap_node *)0x0;
  pMap->nSize = 0;
  pMap->nEntry = 0;
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9HashmapRelease(jx9_hashmap *pMap, int FreeDS)
{
	jx9_hashmap_node *pEntry, *pNext;
	jx9_vm *pVm = pMap->pVm;
	sxu32 n;
	/* Start the release process */
	n = 0;
	pEntry = pMap->pFirst;
	for(;;){
		if( n >= pMap->nEntry ){
			break;
		}
		pNext = pEntry->pPrev; /* Reverse link */
		/* Restore the jx9_value to the free list */
		jx9VmUnsetMemObj(pVm, pEntry->nValIdx);
		/* Release the node */
		if( pEntry->iType == HASHMAP_BLOB_NODE ){
			SyBlobRelease(&pEntry->xKey.sKey);
		}
		SyMemBackendPoolFree(&pVm->sAllocator, pEntry);
		/* Point to the next entry */
		pEntry = pNext;
		n++;
	}
	if( pMap->nEntry > 0 ){
		/* Release the hash bucket */
		SyMemBackendFree(&pVm->sAllocator, pMap->apBucket);
	}
	if( FreeDS ){
		/* Free the whole instance */
		SyMemBackendPoolFree(&pVm->sAllocator, pMap);
	}else{
		/* Keep the instance but reset it's fields */
		pMap->apBucket = 0;
		pMap->iNextIdx = 0;
		pMap->nEntry = pMap->nSize = 0;
		pMap->pFirst = pMap->pLast = pMap->pCur = 0;
	}
	return SXRET_OK;
}